

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::Detail::StringMakerBase<true>::convert<bsim::dynamic_bit_vector>
                    (dynamic_bit_vector *_value)

{
  ostream *in_RDI;
  ostringstream oss;
  dynamic_bit_vector *in_stack_fffffffffffffe48;
  ostream *out;
  ostringstream local_188 [392];
  
  out = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  bsim::operator<<(out,in_stack_fffffffffffffe48);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }